

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
async_shutdown(connection<websocketpp::config::asio::transport_config> *this,
              shutdown_handler *callback)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  code *local_d8;
  element_type *peStack_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  element_type *peStack_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  io_service_ptr piStack_48;
  element_type *peStack_40;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"asio connection async_shutdown",in_RCX);
  }
  get_shared((connection<websocketpp::config::asio::transport_config> *)(local_f8 + 0x10));
  local_d8 = handle_async_shutdown_timeout;
  peStack_d0 = (element_type *)0x0;
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)local_c8,callback);
  local_a8 = ZEXT816(0);
  peStack_98 = (element_type *)local_f8._16_8_;
  _Stack_90._M_pi = _Stack_e0._M_pi;
  local_f8._16_8_ = (element_type *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piStack_48 = (io_service_ptr)0x0;
  peStack_40 = (element_type *)0x0;
  local_58._M_allocated_capacity = (size_type)operator_new(0x50);
  *(code **)local_58._M_allocated_capacity = local_d8;
  *(element_type **)(local_58._M_allocated_capacity + 8) = peStack_d0;
  *(undefined1 (*) [16])(local_58._M_allocated_capacity + 0x10) = ZEXT816(0) << 0x20;
  *(undefined8 *)(local_58._M_allocated_capacity + 0x20) = 0;
  *(undefined8 *)(local_58._M_allocated_capacity + 0x28) = local_b8._8_8_;
  if (local_b8._0_8_ != 0) {
    *(undefined8 *)(local_58._M_allocated_capacity + 0x10) = local_c8._0_8_;
    *(undefined8 *)(local_58._M_allocated_capacity + 0x18) = local_c8._8_8_;
    *(undefined8 *)(local_58._M_allocated_capacity + 0x20) = local_b8._0_8_;
    local_b8 = ZEXT816(0) << 0x20;
  }
  *(undefined8 *)(local_58._M_allocated_capacity + 0x38) = 0;
  *(undefined8 *)(local_58._M_allocated_capacity + 0x48) = 0;
  *(undefined8 *)(local_58._M_allocated_capacity + 0x30) = local_a8._0_8_;
  *(undefined8 *)(local_58._M_allocated_capacity + 0x38) = local_a8._8_8_;
  *(element_type **)(local_58._M_allocated_capacity + 0x40) = peStack_98;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_58._M_allocated_capacity + 0x48) =
       _Stack_90._M_pi;
  local_a8 = ZEXT816(0);
  peStack_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_40 = (element_type *)
               std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
               ::_M_invoke;
  piStack_48 = (io_service_ptr)
               std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
               ::_M_manager;
  set_timer((connection<websocketpp::config::asio::transport_config> *)local_f8,(long)this,
            (timer_handler *)0x1388);
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  local_88 = (element_type *)local_f8._0_8_;
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (piStack_48 != (io_service_ptr)0x0) {
    (*(code *)piStack_48)(&local_58,&local_58,3);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if ((code *)local_b8._0_8_ != (code *)0x0) {
    (*(code *)local_b8._0_8_)
              ((function<void_(const_std::error_code_&)> *)local_c8,
               (function<void_(const_std::error_code_&)> *)local_c8,3);
  }
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
  }
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_f8);
  local_d8 = handle_async_shutdown;
  peStack_d0 = (element_type *)0x0;
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)local_c8,callback);
  local_a8._8_8_ = _Stack_80._M_pi;
  local_a8._0_8_ = local_88;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vpextrq_avx(local_a8,1);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  peStack_98 = (element_type *)local_f8._0_8_;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_unused._M_object = (pointer)0x0;
  local_78._8_8_ = 0;
  pcStack_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x50);
  *(code **)local_78._M_unused._0_8_ = local_d8;
  *(element_type **)((long)local_78._M_unused._0_8_ + 8) = peStack_d0;
  *(undefined1 (*) [16])((long)local_78._M_unused._0_8_ + 0x10) = ZEXT816(0) << 0x20;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x20) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x28) = local_b8._8_8_;
  if (local_b8._0_8_ != 0) {
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = local_c8._0_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = local_c8._8_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x20) = local_b8._0_8_;
    local_b8 = ZEXT816(0) << 0x20;
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x38) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x48) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x30) = local_a8._0_8_;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x38) = local_a8._8_8_;
  *(element_type **)((long)local_78._M_unused._0_8_ + 0x40) = peStack_98;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x48) =
       _Stack_90._M_pi;
  local_a8 = ZEXT816(0);
  peStack_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_60 = std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
               ::_M_invoke;
  pcStack_68 = std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
               ::_M_manager;
  basic_socket::connection::async_shutdown
            (&this->super_socket_con_type,(shutdown_handler *)&local_78);
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,3);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if ((code *)local_b8._0_8_ != (code *)0x0) {
    (*(code *)local_b8._0_8_)
              ((function<void_(const_std::error_code_&)> *)local_c8,
               (function<void_(const_std::error_code_&)> *)local_c8,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void async_shutdown(shutdown_handler callback) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection async_shutdown");
        }

        timer_ptr shutdown_timer;
        shutdown_timer = set_timer(
            config::timeout_socket_shutdown,
            lib::bind(
                &type::handle_async_shutdown_timeout,
                get_shared(),
                shutdown_timer,
                callback,
                lib::placeholders::_1
            )
        );

        socket_con_type::async_shutdown(
            lib::bind(
                &type::handle_async_shutdown,
                get_shared(),
                shutdown_timer,
                callback,
                lib::placeholders::_1
            )
        );
    }